

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O0

void __thiscall
nuraft::asio_rpc_client::sent
          (asio_rpc_client *this,ptr<req_msg> *req,ptr<buffer> *buf,rpc_handler *when_done,
          error_code err,size_t bytes_transferred)

{
  bool bVar1;
  int32 args_3;
  int iVar2;
  element_type *peVar3;
  element_type *this_00;
  error_code *this_01;
  char *args_1;
  asio_rpc_client *in_RDI;
  ptr<rpc_exception> except;
  ptr<resp_msg> rsp;
  ptr<buffer> resp_buf;
  ptr<asio_rpc_client> self;
  enable_shared_from_this<nuraft::asio_rpc_client> *in_stack_fffffffffffffdf8;
  shared_ptr<nuraft::req_msg> *in_stack_fffffffffffffe00;
  _Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::shared_ptr<nuraft::buffer>_&,_std::error_code,_unsigned_long)>
  *func;
  shared_ptr<nuraft::buffer> *in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  ssl_socket *in_stack_fffffffffffffe18;
  basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
  *in_stack_fffffffffffffe20;
  offset_in_asio_rpc_client_to_subr *in_stack_fffffffffffffe28;
  error_code *this_02;
  int args;
  undefined4 in_stack_fffffffffffffe30;
  undefined7 in_stack_fffffffffffffe40;
  undefined1 uVar4;
  _Placeholder<2> *__args_5;
  string local_198 [32];
  strfmt<100> local_178;
  char *local_108;
  code *local_e0;
  undefined8 local_d8;
  size_t in_stack_ffffffffffffff48;
  error_code local_10;
  
  std::enable_shared_from_this<nuraft::asio_rpc_client>::shared_from_this(in_stack_fffffffffffffdf8)
  ;
  bVar1 = std::error_code::operator_cast_to_bool(&local_10);
  if (bVar1) {
    asio::
    basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
    ::cancel(in_stack_fffffffffffffe20);
    std::atomic<bool>::operator=
              ((atomic<bool> *)in_stack_fffffffffffffe00,
               SUB81((ulong)in_stack_fffffffffffffdf8 >> 0x38,0));
    std::shared_ptr<nuraft::resp_msg>::shared_ptr((shared_ptr<nuraft::resp_msg> *)0x1a89c0);
    strfmt<100>::strfmt(&local_178,"failed to send request to peer %d, %s:%s, error %d, %s");
    this_00 = std::__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1a89e3);
    args_3 = msg_base::get_dst(&this_00->super_msg_base);
    this_01 = (error_code *)std::__cxx11::string::c_str();
    args_1 = (char *)std::__cxx11::string::c_str();
    this_02 = &local_10;
    iVar2 = std::error_code::value(this_02);
    args = (int)((ulong)this_02 >> 0x20);
    std::error_code::message_abi_cxx11_(this_01);
    std::__cxx11::string::c_str();
    local_108 = strfmt<100>::fmt<int,char_const*,char_const*,int,char_const*>
                          ((strfmt<100> *)CONCAT44(iVar2,in_stack_fffffffffffffe30),args,args_1,
                           (char *)this_01,args_3,(char *)in_stack_fffffffffffffe08);
    cs_new<nuraft::rpc_exception,char_const*,std::shared_ptr<nuraft::req_msg>&>
              ((char **)in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
    std::__cxx11::string::~string(local_198);
    close_socket(in_RDI);
    std::
    function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>::
    operator()((function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
                *)CONCAT44(args_3,in_stack_fffffffffffffe10),
               (shared_ptr<nuraft::resp_msg> *)in_stack_fffffffffffffe08,
               (shared_ptr<nuraft::rpc_exception> *)in_stack_fffffffffffffe00);
    std::shared_ptr<nuraft::rpc_exception>::~shared_ptr
              ((shared_ptr<nuraft::rpc_exception> *)0x1a8ad6);
    std::shared_ptr<nuraft::resp_msg>::~shared_ptr((shared_ptr<nuraft::resp_msg> *)0x1a8ae3);
  }
  else {
    nuraft::buffer::alloc(in_stack_ffffffffffffff48);
    uVar4 = in_RDI->ssl_enabled_;
    __args_5 = (_Placeholder<2> *)&in_RDI->ssl_socket_;
    peVar3 = std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1a882a);
    nuraft::buffer::data(peVar3);
    peVar3 = std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1a8846);
    nuraft::buffer::size(peVar3);
    asio::buffer(in_stack_fffffffffffffe00,(size_t)in_stack_fffffffffffffdf8);
    local_e0 = response_read;
    local_d8 = 0;
    func = (_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::shared_ptr<nuraft::buffer>_&,_std::error_code,_unsigned_long)>
            *)&std::placeholders::_2;
    std::
    bind<void(nuraft::asio_rpc_client::*)(std::shared_ptr<nuraft::req_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,std::shared_ptr<nuraft::buffer>&,std::error_code,unsigned_long),std::shared_ptr<nuraft::asio_rpc_client>&,std::shared_ptr<nuraft::req_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,std::shared_ptr<nuraft::buffer>&,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
              (in_stack_fffffffffffffe28,
               (shared_ptr<nuraft::asio_rpc_client> *)in_stack_fffffffffffffe20,
               (shared_ptr<nuraft::req_msg> *)in_stack_fffffffffffffe18,
               (function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
                *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
               in_stack_fffffffffffffe08,
               (_Placeholder<1> *)CONCAT17(uVar4,in_stack_fffffffffffffe40),__args_5);
    aa::
    read<asio::mutable_buffers_1,std::_Bind<void(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<nuraft::req_msg>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,std::shared_ptr<nuraft::buffer>,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,std::shared_ptr<nuraft::buffer>&,std::error_code,unsigned_long)>>
              (SUB81((ulong)in_stack_fffffffffffffe20 >> 0x38,0),in_stack_fffffffffffffe18,
               (socket *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
               (mutable_buffers_1 *)in_stack_fffffffffffffe08,func);
    std::
    _Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::shared_ptr<nuraft::buffer>_&,_std::error_code,_unsigned_long)>
    ::~_Bind((_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::shared_ptr<nuraft::buffer>_&,_std::error_code,_unsigned_long)>
              *)0x1a8916);
    std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x1a8923);
  }
  std::shared_ptr<nuraft::asio_rpc_client>::~shared_ptr
            ((shared_ptr<nuraft::asio_rpc_client> *)0x1a8b58);
  return;
}

Assistant:

void sent( ptr<req_msg>& req,
               ptr<buffer>& buf,
               rpc_handler& when_done,
               std::error_code err,
               size_t bytes_transferred )
    {
        // Now we can safely free the `req_buf`.
        (void)buf;
        ptr<asio_rpc_client> self(this->shared_from_this());
        if (!err) {
            // read a response
            ptr<buffer> resp_buf(buffer::alloc(RPC_RESP_HEADER_SIZE));
            aa::read( ssl_enabled_, ssl_socket_, socket_,
                      asio::buffer(resp_buf->data(), resp_buf->size()),
                      std::bind(&asio_rpc_client::response_read,
                                self,
                                req,
                                when_done,
                                resp_buf,
                                std::placeholders::_1,
                                std::placeholders::_2));

        } else {
            operation_timer_.cancel();
            abandoned_ = true;
            ptr<resp_msg> rsp;
            ptr<rpc_exception> except
                ( cs_new<rpc_exception>
                  ( sstrfmt( "failed to send request to peer %d, %s:%s, "
                             "error %d, %s" )
                           .fmt( req->get_dst(), host_.c_str(),
                                 port_.c_str(), err.value(), err.message().c_str() ),
                    req ) );
            close_socket();
            when_done(rsp, except);
        }
    }